

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnLoopExpr(BinaryReaderIR *this,Type sig_type)

{
  bool bVar1;
  pointer pBVar2;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_48;
  Enum local_3c;
  ExprList *local_38;
  ExprList *expr_list;
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
  local_28;
  __single_object expr;
  BinaryReaderIR *this_local;
  Type sig_type_local;
  
  expr._M_t.
  super___uniq_ptr_impl<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::BlockExprBase<(wabt::ExprType)27>_*,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
  .super__Head_base<0UL,_wabt::BlockExprBase<(wabt::ExprType)27>_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>,_true,_true>
        )(__uniq_ptr_data<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>,_true,_true>
          )this;
  std::make_unique<wabt::BlockExprBase<(wabt::ExprType)27>>();
  pBVar2 = std::
           unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
           ::operator->(&local_28);
  expr_list = (ExprList *)sig_type;
  SetBlockDeclaration(this,&(pBVar2->block).decl,sig_type);
  pBVar2 = std::
           unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
           ::operator->(&local_28);
  local_38 = &(pBVar2->block).exprs;
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_48,&local_28);
  local_3c = (Enum)AppendExpr(this,&local_48);
  bVar1 = Failed((Result)local_3c);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_48);
  if (bVar1) {
    Result::Result((Result *)&sig_type_local,Error);
  }
  else {
    PushLabel(this,Loop,local_38,(Expr *)0x0);
    Result::Result((Result *)&sig_type_local,Ok);
  }
  std::
  unique_ptr<wabt::BlockExprBase<(wabt::ExprType)27>,_std::default_delete<wabt::BlockExprBase<(wabt::ExprType)27>_>_>
  ::~unique_ptr(&local_28);
  return (Result)sig_type_local.enum_;
}

Assistant:

Result BinaryReaderIR::OnLoopExpr(Type sig_type) {
  auto expr = std::make_unique<LoopExpr>();
  SetBlockDeclaration(&expr->block.decl, sig_type);
  ExprList* expr_list = &expr->block.exprs;
  CHECK_RESULT(AppendExpr(std::move(expr)));
  PushLabel(LabelType::Loop, expr_list);
  return Result::Ok;
}